

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::EntryPushJavascriptArrayNoFastPath
              (ScriptContext *scriptContext,JavascriptArray *arr,Var *args,uint argCount)

{
  ulong uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  int operationSucceeded;
  BOOL operationSucceeded_00;
  Var pvVar5;
  undefined4 *puVar6;
  ulong uVar7;
  uint32 initIndex;
  ulong uVar8;
  undefined1 local_80 [8];
  ThrowTypeErrorOnFailureHelper h;
  JsReentLock jsReentLock;
  BigIndex big;
  
  h.m_functionName = (PCWSTR)scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)h.m_functionName)->noJsReentrancy;
  ((ThreadContext *)h.m_functionName)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)&h.m_functionName,arr);
  uVar2 = (arr->super_ArrayObject).length;
  h.m_scriptContext = (ScriptContext *)anon_var_dwarf_6940e54;
  uVar7 = (ulong)argCount;
  uVar8 = 0;
  local_80 = (undefined1  [8])scriptContext;
  while( true ) {
    uVar1 = uVar2 + uVar8;
    initIndex = (uint32)uVar1;
    if ((uVar7 <= uVar8) || (initIndex == 0xffffffff)) break;
    operationSucceeded =
         (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
           super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                   (arr,uVar1 & 0xffffffff,args[uVar8],0);
    ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
              ((ThrowTypeErrorOnFailureHelper *)local_80,operationSucceeded);
    uVar8 = uVar8 + 1;
  }
  if (uVar8 < uVar7) {
    EnsureNonNativeArray(arr);
    if (initIndex != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x154e,"(n == JavascriptArray::MaxArrayLength)",
                                  "n == JavascriptArray::MaxArrayLength");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    BigIndex::BigIndex((BigIndex *)&jsReentLock.m_savedNoJsReentrancy,initIndex);
    if (uVar7 < uVar8) {
      uVar7 = uVar8;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      *(undefined1 *)(h.m_functionName + 0x84) = jsReentLock.m_arrayObject2._0_1_;
      operationSucceeded_00 =
           BigIndex::SetItem((BigIndex *)&jsReentLock.m_savedNoJsReentrancy,arr,args[uVar8]);
      ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                ((ThrowTypeErrorOnFailureHelper *)local_80,operationSucceeded_00);
      JsReentLock::MutateArrayObject((JsReentLock *)&h.m_functionName);
      *(undefined1 *)(h.m_functionName + 0x84) = 1;
      if (jsReentLock._24_4_ != -1) {
        jsReentLock._24_4_ = jsReentLock._24_4_ + 1;
      }
    }
    (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(arr);
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec5a,(PCWSTR)0x0);
  }
  (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(arr);
  pvVar5 = JavascriptNumber::ToVar(initIndex,scriptContext);
  *(undefined1 *)(h.m_functionName + 0x84) = jsReentLock.m_arrayObject2._0_1_;
  return pvVar5;
}

Assistant:

Var JavascriptArray::EntryPushJavascriptArrayNoFastPath(ScriptContext * scriptContext, JavascriptArray* arr, Var * args, uint argCount)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arr);

        uint n = arr->length;
        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.push"));

        // First handle "small" indices.
        uint index;
        for (index = 0; index < argCount && n < JavascriptArray::MaxArrayLength; ++index, ++n)
        {
            // Set Item is overridden by CrossSiteObject, so no need to check for IsCrossSiteObject()
            h.ThrowTypeErrorOnFailure(arr->SetItem(n, args[index], PropertyOperation_None));
        }

        // Use BigIndex if we need to push indices >= MaxArrayLength
        if (index < argCount)
        {
            // Not supporting native array with BigIndex.
            arr = EnsureNonNativeArray(arr);
            Assert(n == JavascriptArray::MaxArrayLength);
            for (BigIndex big = n; index < argCount; ++index, ++big)
            {
                JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(big.SetItem(arr, args[index])));
            }

#ifdef VALIDATE_ARRAY
            arr->ValidateArray();
#endif
            // This is where we should set the length, but for arrays it cannot be >= MaxArrayLength
            JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
        }

#ifdef VALIDATE_ARRAY
        arr->ValidateArray();
#endif
        return JavascriptNumber::ToVar(n, scriptContext);
    }